

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::createSpecialCharacterList
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  array<irr::core::string<unsigned_long>_> *this_00;
  string<unsigned_long> local_20;
  
  this_00 = &this->SpecialCharacters;
  core::string<unsigned_long>::string<char>(&local_20,"&amp;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  core::string<unsigned_long>::string<char>(&local_20,"<lt;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  core::string<unsigned_long>::string<char>(&local_20,">gt;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  core::string<unsigned_long>::string<char>(&local_20,"\"quot;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  core::string<unsigned_long>::string<char>(&local_20,"\'apos;");
  core::array<irr::core::string<unsigned_long>_>::push_back(this_00,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  return;
}

Assistant:

void createSpecialCharacterList()
	{
		// list of strings containing special symbols, 
		// the first character is the special character,
		// the following is the symbol string without trailing &.

		SpecialCharacters.push_back("&amp;");
		SpecialCharacters.push_back("<lt;");
		SpecialCharacters.push_back(">gt;");
		SpecialCharacters.push_back("\"quot;");
		SpecialCharacters.push_back("'apos;");
		
	}